

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

ON_TextureMapping *
ON_TextureMapping::FromModelComponentRef
          (ON_ModelComponentReference *model_component_reference,
          ON_TextureMapping *none_return_value)

{
  ON_ModelComponent *p;
  ON_TextureMapping *pOVar1;
  
  p = ON_ModelComponentReference::ModelComponent(model_component_reference);
  pOVar1 = Cast(&p->super_ON_Object);
  if (pOVar1 == (ON_TextureMapping *)0x0) {
    pOVar1 = none_return_value;
  }
  return pOVar1;
}

Assistant:

const ON_TextureMapping* ON_TextureMapping::FromModelComponentRef(
  const class ON_ModelComponentReference& model_component_reference,
  const ON_TextureMapping* none_return_value
  )
{
  const ON_TextureMapping* p = ON_TextureMapping::Cast(model_component_reference.ModelComponent());
  return (nullptr != p) ? p : none_return_value;
}